

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

bool __thiscall
iDynTree::KinDynComputations::setRobotState
          (KinDynComputations *this,Span<const_double,__1L> s,Span<const_double,__1L> s_dot,
          Span<const_double,__1L> world_gravity)

{
  bool bVar1;
  Twist base_velocity;
  Transform world_T_base;
  VectorDynSize aVStack_128 [32];
  SpatialMotionVector local_108;
  VectorFixSize<3U> local_d8;
  Twist local_c0 [48];
  Transform local_90 [96];
  
  iDynTree::Transform::Identity();
  SpatialVector<iDynTree::SpatialMotionVector>::Zero();
  iDynTree::Twist::Twist(local_c0,&local_108);
  iDynTree::VectorDynSize::VectorDynSize
            ((VectorDynSize *)&local_108,s.storage_.super_extent_type<_1L>.size_.size_,
             s.storage_.data_);
  iDynTree::VectorDynSize::VectorDynSize
            (aVStack_128,s_dot.storage_.super_extent_type<_1L>.size_.size_,s_dot.storage_.data_);
  VectorFixSize<3U>::VectorFixSize
            (&local_d8,world_gravity.storage_.data_,
             world_gravity.storage_.super_extent_type<_1L>.size_);
  bVar1 = setRobotState(this,local_90,(VectorDynSize *)&local_108,local_c0,aVStack_128,&local_d8);
  iDynTree::VectorDynSize::~VectorDynSize(aVStack_128);
  iDynTree::VectorDynSize::~VectorDynSize((VectorDynSize *)&local_108);
  return bVar1;
}

Assistant:

bool KinDynComputations::setRobotState(Span<const double> s,
                                       Span<const double> s_dot,
                                       Span<const double> world_gravity)
{
    Transform world_T_base = Transform::Identity();
    Twist base_velocity = Twist::Zero();

    return setRobotState(world_T_base, s,
                         base_velocity, s_dot,
                         world_gravity);
}